

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

void __thiscall ProcessThread::run(ProcessThread *this)

{
  uint uVar1;
  int *piVar2;
  pointer ppVar3;
  element_type *this_00;
  uint *puVar4;
  bool bVar5;
  Log local_108;
  Log local_f8;
  Log local_e8;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_d8;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_d0;
  anon_class_16_2_6691087b_for_obj local_c8;
  _Base_ptr local_b8;
  _Base_ptr local_b0;
  undefined1 local_a8 [8];
  SharedPtr loop;
  Process *process;
  _Self local_88;
  iterator proc;
  Log local_70;
  Log local_60 [2];
  byte local_39;
  undefined1 local_38 [7];
  bool done;
  unique_lock<std::mutex> lock;
  uint local_20;
  pid_t p;
  int ret;
  char ch;
  ssize_t r;
  ProcessThread *this_local;
  
  r = (ssize_t)this;
  while( true ) {
    do {
      _ret = read(sProcessPipe[0],(void *)((long)&p + 3),1);
    } while (_ret != 1);
    if (p._3_1_ == 's') break;
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_38,&sProcessMutex);
    local_39 = 0;
    do {
      do {
        lock._12_4_ = waitpid(0,(int *)&local_20,1);
        bVar5 = false;
        if (lock._12_4_ == -1) {
          piVar2 = __errno_location();
          bVar5 = *piVar2 == 4;
        }
      } while (bVar5);
      if (lock._12_4_ == -1) {
        local_39 = 1;
        piVar2 = __errno_location();
        if (*piVar2 != 10) {
          ::error();
          Log::operator<<(&local_70,(char *)&proc);
          __errno_location();
          Log::operator<<(local_60,(int32_t)&local_70);
          Log::~Log(local_60);
          Log::~Log(&local_70);
          Log::~Log((Log *)&proc);
        }
      }
      else if (lock._12_4_ == 0) {
        local_39 = 1;
      }
      else {
        if ((local_20 & 0x7f) == 0) {
          local_20 = (int)(local_20 & 0xff00) >> 8;
        }
        else {
          local_20 = 0xffffffff;
        }
        local_88._M_node =
             (_Base_ptr)
             std::
             map<int,_ProcessThread::ProcessData,_std::less<int>,_std::allocator<std::pair<const_int,_ProcessThread::ProcessData>_>_>
             ::find(&sProcesses,(key_type_conflict *)&lock.field_0xc);
        process = (Process *)
                  std::
                  map<int,_ProcessThread::ProcessData,_std::less<int>,_std::allocator<std::pair<const_int,_ProcessThread::ProcessData>_>_>
                  ::end(&sProcesses);
        bVar5 = std::operator!=(&local_88,(_Self *)&process);
        if (bVar5) {
          ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_ProcessThread::ProcessData>_>::
                   operator->(&local_88);
          loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ppVar3->second).proc;
          if ((Process *)
              loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (Process *)0x0) {
            std::_Rb_tree_iterator<std::pair<const_int,_ProcessThread::ProcessData>_>::operator->
                      (&local_88);
            std::weak_ptr<EventLoop>::lock((weak_ptr<EventLoop> *)local_a8);
            local_b0 = (_Base_ptr)
                       std::_Rb_tree_iterator<std::pair<const_int,_ProcessThread::ProcessData>_>::
                       operator++(&local_88,0);
            local_b8 = (_Base_ptr)
                       std::
                       map<int,ProcessThread::ProcessData,std::less<int>,std::allocator<std::pair<int_const,ProcessThread::ProcessData>>>
                       ::erase_abi_cxx11_((map<int,ProcessThread::ProcessData,std::less<int>,std::allocator<std::pair<int_const,ProcessThread::ProcessData>>>
                                           *)&sProcesses,(iterator)local_b0);
            std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_38);
            bVar5 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_a8);
            if (bVar5) {
              this_00 = std::
                        __shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                        operator->((__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_a8);
              local_c8.process =
                   (Process *)
                   loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              local_c8.ret = local_20;
              EventLoop::callLater<ProcessThread::run()::__0>(this_00,&local_c8);
            }
            else {
              Process::finish((Process *)
                              loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi,local_20);
            }
            std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_38);
            std::shared_ptr<EventLoop>::~shared_ptr((shared_ptr<EventLoop> *)local_a8);
          }
        }
        else if (sPending == 0) {
          ::error();
          Log::operator<<(&local_f8,(char *)&local_108);
          Log::operator<<(&local_e8,(int32_t)&local_f8);
          Log::~Log(&local_e8);
          Log::~Log(&local_f8);
          Log::~Log(&local_108);
        }
        else {
          local_d0._M_cur =
               (__node_type *)
               std::
               unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               ::find(&sPendingPids,(key_type *)&lock.field_0xc);
          local_d8._M_cur =
               (__node_type *)
               std::
               unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               ::end(&sPendingPids);
          bVar5 = std::__detail::operator==(&local_d0,&local_d8);
          uVar1 = local_20;
          if (!bVar5) {
            __assert_fail("sPendingPids.find(p) == sPendingPids.end()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Process.cpp"
                          ,0xcc,"virtual void ProcessThread::run()");
          }
          puVar4 = (uint *)std::
                           unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           ::operator[](&sPendingPids,(key_type *)&lock.field_0xc);
          *puVar4 = uVar1;
        }
      }
    } while (((local_39 ^ 0xff) & 1) != 0);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  }
  return;
}

Assistant:

void ProcessThread::run()
{
    ssize_t r;
    for (;;) {
        char ch;
        r = ::read(sProcessPipe[0], &ch, sizeof(char));
        if (r == 1) {
            if (ch == 's') {
                break;
            } else {
                int ret;
                pid_t p;
                std::unique_lock<std::mutex> lock(sProcessMutex);
                bool done = false;
                do {
                    // find out which process we're waking up on
                    eintrwrap(p, ::waitpid(0, &ret, WNOHANG));
                    switch (p) {
                    case 0:
                        // we're done
                        done = true;
                        break;
                    case -1:
                        done = true;
                        if (errno == ECHILD)
                            break;
                        // this is bad
                        error() << "waitpid error" << errno;
                        break;
                    default:
                        // printf("successfully waited for pid (got %d)\n", p);
                        // child process with pid=p just exited.
                        if (WIFEXITED(ret)) {
                            ret = WEXITSTATUS(ret);
                        } else {
                            ret = Process::ReturnCrashed;
                        }
                        // find the process object to this child process
                        auto proc = sProcesses.find(p);
                        if (proc != sProcesses.end()) {
                            Process *process = proc->second.proc;
                            if (process != nullptr) {
                                EventLoop::SharedPtr loop = proc->second.loop.lock();
                                sProcesses.erase(proc++);
                                lock.unlock();
                                if (loop) {
                                    loop->callLater([process, ret]() { process->finish(ret); });
                                } else {
                                    process->finish(ret);
                                }
                                lock.lock();
                            }
                        } else {
                            if (sPending) {
                                assert(sPendingPids.find(p) == sPendingPids.end());
                                sPendingPids[p] = ret;
                            } else {
                                error() << "couldn't find process for pid" << p;
                            }
                        }
                    }
                } while (!done);
            }
        }
    }
    // printf("process thread died for some reason\n");
}